

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISkin::draw3DTabBody
          (CGUISkin *this,IGUIElement *element,bool border,bool background,rect<int> *rect,
          rect<int> *clip,s32 tabHeight,EGUI_ALIGNMENT alignment)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte in_CL;
  byte in_DL;
  long *in_RDI;
  undefined8 *in_R8;
  undefined8 in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  SColor c2;
  SColor c1;
  rect<int> tr;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  if (in_RDI[0x4b] != 0) {
    local_38 = *in_R8;
    local_30 = in_R8[1];
    local_28 = in_R9;
    local_20 = in_R8;
    if (in_stack_00000008 == -1) {
      in_stack_00000008 = (**(code **)(*in_RDI + 0x10))(in_RDI,7,0xffffffff);
    }
    if ((local_11 & 1) != 0) {
      if (in_stack_00000010 == 0) {
        local_38._4_4_ = in_stack_00000008 + 2 + local_38._4_4_;
        local_30._0_4_ = (int)local_38 + 1;
        plVar1 = (long *)in_RDI[0x4b];
        uVar2 = (**(code **)*in_RDI)(in_RDI,3);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
        local_38 = CONCAT44(local_38._4_4_,*(int *)(local_20 + 1) + -1);
        local_30 = CONCAT44(local_30._4_4_,*(int *)(local_20 + 1));
        plVar1 = (long *)in_RDI[0x4b];
        uVar2 = (**(code **)*in_RDI)(in_RDI,1);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
        local_30._4_4_ = (int)((ulong)local_20[1] >> 0x20);
        local_38._0_4_ = (int)*local_20;
        local_38 = CONCAT44(local_30._4_4_ + -1,(int)local_38);
        plVar1 = (long *)in_RDI[0x4b];
        local_30 = local_20[1];
        uVar2 = (**(code **)*in_RDI)(in_RDI,1);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
      }
      else {
        local_30._4_4_ = local_30._4_4_ - (in_stack_00000008 + 2);
        local_30._0_4_ = (int)local_38 + 1;
        plVar1 = (long *)in_RDI[0x4b];
        uVar2 = (**(code **)*in_RDI)(in_RDI,3);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
        local_38 = CONCAT44(local_38._4_4_,*(int *)(local_20 + 1) + -1);
        local_30 = CONCAT44(local_30._4_4_,*(int *)(local_20 + 1));
        plVar1 = (long *)in_RDI[0x4b];
        uVar2 = (**(code **)*in_RDI)(in_RDI,1);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
        local_38._4_4_ = (int)((ulong)*local_20 >> 0x20);
        local_30._0_4_ = (int)local_20[1];
        local_30 = CONCAT44(local_38._4_4_ + 1,(int)local_30);
        plVar1 = (long *)in_RDI[0x4b];
        local_38 = *local_20;
        uVar2 = (**(code **)*in_RDI)(in_RDI,3);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
      }
    }
    if ((local_12 & 1) != 0) {
      if (in_stack_00000010 == 0) {
        local_38._4_4_ = (int)((ulong)*local_20 >> 0x20);
        local_38._0_4_ = (int)*local_20;
        local_30._0_4_ = (int)local_20[1];
        local_30._4_4_ = (int)((ulong)local_20[1] >> 0x20);
        local_38 = CONCAT44(in_stack_00000008 + 2 + local_38._4_4_,(int)local_38 + 1);
        local_30 = CONCAT44(local_30._4_4_ + -1,(int)local_30 + -1);
      }
      else {
        local_38._0_4_ = (int)*local_20;
        local_38._4_4_ = (int)((ulong)*local_20 >> 0x20);
        local_38 = CONCAT44(local_38._4_4_ + -1,(int)local_38 + 1);
        local_30._0_4_ = (int)local_20[1];
        local_30._4_4_ = (int)((ulong)local_20[1] >> 0x20);
        local_30 = CONCAT44(local_30._4_4_ - (in_stack_00000008 + 2),(int)local_30 + -1);
      }
      if ((*(byte *)(in_RDI + 0x4c) & 1) == 0) {
        plVar1 = (long *)in_RDI[0x4b];
        uVar2 = (**(code **)*in_RDI)(in_RDI,2);
        (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_38,local_28);
      }
      else {
        uVar2 = (**(code **)*in_RDI)(in_RDI,2);
        uVar3 = (**(code **)*in_RDI)(in_RDI,1);
        (**(code **)(*(long *)in_RDI[0x4b] + 0x1a0))
                  ((long *)in_RDI[0x4b],&local_38,uVar2,uVar2,uVar3,uVar3,local_28);
      }
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DTabBody(IGUIElement *element, bool border, bool background,
		const core::rect<s32> &rect, const core::rect<s32> *clip, s32 tabHeight, EGUI_ALIGNMENT alignment)
{
	if (!Driver)
		return;

	core::rect<s32> tr = rect;

	if (tabHeight == -1)
		tabHeight = getSize(gui::EGDS_BUTTON_HEIGHT);

	// draw border.
	if (border) {
		if (alignment == EGUIA_UPPERLEFT) {
			// draw left hightlight
			tr.UpperLeftCorner.Y += tabHeight + 2;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);

			// draw right shadow
			tr.UpperLeftCorner.X = rect.LowerRightCorner.X - 1;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);

			// draw lower shadow
			tr = rect;
			tr.UpperLeftCorner.Y = tr.LowerRightCorner.Y - 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);
		} else {
			// draw left hightlight
			tr.LowerRightCorner.Y -= tabHeight + 2;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);

			// draw right shadow
			tr.UpperLeftCorner.X = rect.LowerRightCorner.X - 1;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);

			// draw lower shadow
			tr = rect;
			tr.LowerRightCorner.Y = tr.UpperLeftCorner.Y + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);
		}
	}

	if (background) {
		if (alignment == EGUIA_UPPERLEFT) {
			tr = rect;
			tr.UpperLeftCorner.Y += tabHeight + 2;
			tr.LowerRightCorner.X -= 1;
			tr.UpperLeftCorner.X += 1;
			tr.LowerRightCorner.Y -= 1;
		} else {
			tr = rect;
			tr.UpperLeftCorner.X += 1;
			tr.UpperLeftCorner.Y -= 1;
			tr.LowerRightCorner.X -= 1;
			tr.LowerRightCorner.Y -= tabHeight + 2;
			// tr.UpperLeftCorner.X += 1;
		}

		if (!UseGradient)
			Driver->draw2DRectangle(getColor(EGDC_3D_FACE), tr, clip);
		else {
			video::SColor c1 = getColor(EGDC_3D_FACE);
			video::SColor c2 = getColor(EGDC_3D_SHADOW);
			Driver->draw2DRectangle(tr, c1, c1, c2, c2, clip);
		}
	}
}